

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O1

void __thiscall
embree::ParallelRadixSort<embree::parallel_map<unsigned_long,_float>::KeyValue,_unsigned_long>::sort
          (ParallelRadixSort<embree::parallel_map<unsigned_long,_float>::KeyValue,_unsigned_long>
           *this,size_t blockSize)

{
  float fVar1;
  long lVar2;
  unsigned_long uVar3;
  undefined8 uVar4;
  KeyValue *pKVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  KeyValue *pKVar9;
  KeyValue *pKVar10;
  KeyValue *__i;
  KeyValue *pKVar11;
  size_t numTasks;
  KeyValue *pKVar12;
  size_t __n;
  KeyValue *__last;
  float fStack_40;
  
  uVar8 = this->N;
  if (blockSize < uVar8) {
    uVar7 = ((blockSize + uVar8) - 1) / blockSize;
    iVar6 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    uVar8 = (long)iVar6;
    if (uVar7 < (ulong)(long)iVar6) {
      uVar8 = uVar7;
    }
    numTasks = 0x40;
    if (uVar8 < 0x40) {
      numTasks = uVar8;
    }
    tbbRadixSort(this,numTasks);
    return;
  }
  if (uVar8 != 0) {
    pKVar11 = this->src;
    __last = pKVar11 + uVar8;
    lVar2 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<embree::parallel_map<unsigned_long,float>::KeyValue*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(embree::parallel_map<unsigned_long,float>::KeyValue_const&,embree::parallel_map<unsigned_long,float>::KeyValue_const&)>>
              (pKVar11,__last,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_embree::parallel_map<unsigned_long,_float>::KeyValue_&,_const_embree::parallel_map<unsigned_long,_float>::KeyValue_&)>
                )0xe20064);
    if ((long)uVar8 < 0x11) {
      if (uVar8 != 1) {
        pKVar10 = pKVar11 + 1;
        pKVar12 = pKVar11;
        do {
          pKVar9 = pKVar10;
          uVar8 = pKVar12[1].key;
          if (uVar8 < pKVar11->key) {
            uVar3 = pKVar9->key;
            uVar4 = *(undefined8 *)&pKVar9->val;
            memmove((void *)((long)pKVar12 + (0x20 - ((long)pKVar9 - (long)pKVar11))),pKVar11,
                    (long)pKVar9 - (long)pKVar11);
            pKVar11->key = uVar3;
            fStack_40 = (float)uVar4;
            pKVar11->val = fStack_40;
          }
          else {
            fVar1 = pKVar9->val;
            uVar7 = pKVar12->key;
            pKVar10 = pKVar9;
            while (uVar8 < uVar7) {
              pKVar10->val = pKVar10[-1].val;
              pKVar10->key = pKVar10[-1].key;
              uVar7 = pKVar10[-2].key;
              pKVar10 = pKVar10 + -1;
            }
            pKVar10->key = uVar8;
            pKVar10->val = fVar1;
          }
          pKVar10 = pKVar9 + 1;
          pKVar12 = pKVar9;
        } while (pKVar9 + 1 != __last);
      }
    }
    else {
      __n = 0x10;
      pKVar10 = pKVar11;
      pKVar12 = pKVar11 + 1;
      do {
        pKVar9 = (KeyValue *)((long)&pKVar11->key + __n);
        uVar8 = *(ulong *)((long)&pKVar11->key + __n);
        if (uVar8 < pKVar11->key) {
          uVar3 = pKVar9->key;
          uVar4 = *(undefined8 *)&pKVar9->val;
          memmove(pKVar11 + 1,pKVar11,__n);
          pKVar11->key = uVar3;
          fStack_40 = (float)uVar4;
          pKVar11->val = fStack_40;
        }
        else {
          fVar1 = pKVar9->val;
          uVar7 = pKVar10->key;
          pKVar10 = pKVar9;
          pKVar5 = pKVar12;
          while (uVar8 < uVar7) {
            pKVar10 = pKVar5 + -1;
            pKVar5->val = pKVar5[-1].val;
            pKVar5->key = pKVar5[-1].key;
            uVar7 = pKVar5[-2].key;
            pKVar5 = pKVar10;
          }
          pKVar10->key = uVar8;
          pKVar10->val = fVar1;
        }
        __n = __n + 0x10;
        pKVar12 = pKVar12 + 1;
        pKVar10 = pKVar9;
      } while (__n != 0x100);
      pKVar11 = pKVar11 + 0x10;
      do {
        uVar8 = pKVar11->key;
        fVar1 = pKVar11->val;
        uVar7 = pKVar11[-1].key;
        pKVar10 = pKVar11;
        while (uVar8 < uVar7) {
          pKVar10->val = pKVar10[-1].val;
          pKVar10->key = pKVar10[-1].key;
          uVar7 = pKVar10[-2].key;
          pKVar10 = pKVar10 + -1;
        }
        pKVar10->key = uVar8;
        pKVar10->val = fVar1;
        pKVar11 = pKVar11 + 1;
      } while (pKVar11 != __last);
    }
  }
  return;
}

Assistant:

void sort(const size_t blockSize)
    {
      assert(blockSize > 0);
      
      /* perform single threaded sort for small N */
      if (N<=blockSize) // handles also special case of 0!
      {	  
        /* do inplace sort inside destination array */
        std::sort(src,src+N,compare<Ty>);
      }
      
      /* perform parallel sort for large N */
      else 
      {
        const size_t numThreads = min((N+blockSize-1)/blockSize,TaskScheduler::threadCount(),size_t(MAX_TASKS));
        tbbRadixSort(numThreads);
      }
    }